

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O1

void __thiscall
wasm::
AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
::AnalysisChecker(AnalysisChecker<wasm::analysis::FiniteIntPowersetLattice,_wasm::analysis::LivenessTransferFunction>
                  *this,FiniteIntPowersetLattice *lattice,LivenessTransferFunction *txfn,
                 string latticeName,string txfnName,uint64_t latticeElementSeed,Name funcName)

{
  long lVar1;
  
  this->lattice = lattice;
  this->txfn = txfn;
  (this->latticeName)._M_dataplus._M_p = (pointer)&(this->latticeName).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->latticeName,*(long *)latticeElementSeed,
             *(long *)(latticeElementSeed + 8) + *(long *)latticeElementSeed);
  (this->txfnName)._M_dataplus._M_p = (pointer)&(this->txfnName).field_2;
  lVar1 = *funcName.super_IString.str._M_len;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->txfnName,lVar1,funcName.super_IString.str._M_len[1] + lVar1);
  this->latticeElementSeed = (uint64_t)funcName.super_IString.str._M_str;
  (this->funcName).super_IString.str._M_len = (size_t)latticeName._M_dataplus._M_p;
  (this->funcName).super_IString.str._M_str = (char *)latticeName._M_string_length;
  return;
}

Assistant:

AnalysisChecker(L& lattice,
                  TxFn& txfn,
                  std::string latticeName,
                  std::string txfnName,
                  uint64_t latticeElementSeed,
                  Name funcName)
    : lattice(lattice), txfn(txfn), latticeName(latticeName),
      txfnName(txfnName), latticeElementSeed(latticeElementSeed),
      funcName(funcName) {}